

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O1

any __thiscall
cs_impl::
cni_helper<cs_impl::any(*)(std::shared_ptr<cs::context_type>const&,std::__cxx11::string_const&),cs_impl::any(*)(std::shared_ptr<cs::context_type>const&,std::__cxx11::string_const&)>
::_call<0,1>(cni_helper<cs_impl::any(*)(std::shared_ptr<cs::context_type>const&,std::__cxx11::string_const&),cs_impl::any(*)(std::shared_ptr<cs::context_type>const&,std::__cxx11::string_const&)>
             *this,vector *args,sequence<0,_1> *param_2)

{
  proxy *in_RAX;
  shared_ptr<cs::context_type> *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  any local_28;
  
  local_28.mDat = in_RAX;
  psVar1 = try_convert_and_check<const_std::shared_ptr<cs::context_type>_&,_const_std::shared_ptr<cs::context_type>_&,_std::shared_ptr<cs::context_type>,_0UL>
           ::convert(*(var **)param_2);
  pbVar2 = try_convert_and_check<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
           ::convert((var *)(*(long *)param_2 + 8));
  if ((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)args[1].super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
              super__Vector_impl_data._M_start)(&local_28,args,psVar1,pbVar2);
    *(undefined8 *)this = 0;
    *(proxy **)this = local_28.mDat;
    local_28.mDat = (proxy *)0x0;
    any::recycle(&local_28);
    return (any)(proxy *)this;
  }
  std::__throw_bad_function_call();
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}